

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_PROBE(effect_handler_context_t_conflict *context)

{
  loc_conflict grid;
  bool bVar1;
  _Bool _Var2;
  wchar_t wVar3;
  monster_conflict *mon_00;
  char *pcVar4;
  char local_78 [8];
  char m_name [80];
  monster *mon;
  _Bool probe;
  wchar_t i;
  effect_handler_context_t_conflict *context_local;
  
  bVar1 = false;
  for (mon._4_4_ = L'\x01'; wVar3 = cave_monster_max(cave), mon._4_4_ < wVar3;
      mon._4_4_ = mon._4_4_ + L'\x01') {
    mon_00 = cave_monster(cave,mon._4_4_);
    if (((mon_00->race != (monster_race *)0x0) &&
        (grid.x = (mon_00->grid).x, grid.y = (mon_00->grid).y,
        _Var2 = square_isview((chunk *)cave,grid), _Var2)) &&
       (_Var2 = monster_is_visible((monster *)mon_00), _Var2)) {
      if (!bVar1) {
        msg("Probing...");
      }
      monster_desc(local_78,0x50,(monster *)mon_00,L'̄');
      pcVar4 = "s";
      if (mon_00->hp == 1) {
        pcVar4 = "";
      }
      msg("%s has %d hit point%s.",local_78,(ulong)(uint)(int)mon_00->hp,pcVar4);
      lore_do_probe((monster *)mon_00);
      bVar1 = true;
    }
  }
  if (bVar1) {
    msg("That\'s all.");
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_PROBE(effect_handler_context_t *context)
{
	int i;

	bool probe = false;

	/* Probe all (nearby) monsters */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);

		/* Paranoia -- Skip dead monsters */
		if (!mon->race) continue;

		/* Require line of sight */
		if (!square_isview(cave, mon->grid)) continue;

		/* Probe visible monsters */
		if (monster_is_visible(mon)) {
			char m_name[80];

			/* Start the message */
			if (!probe) msg("Probing...");

			/* Get "the monster" or "something" */
			monster_desc(m_name, sizeof(m_name), mon,
				MDESC_IND_HID | MDESC_CAPITAL | MDESC_COMMA);

			/* Describe the monster */
			msg("%s has %d hit point%s.", m_name, mon->hp, (mon->hp == 1) ? "" : "s");

			/* Learn all of the non-spell, non-treasure flags */
			lore_do_probe(mon);

			/* Probe worked */
			probe = true;
		}
	}

	/* Done */
	if (probe) {
		msg("That's all.");
		context->ident = true;
	}

	return true;
}